

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void S_ChannelEnded(FISoundChannel *ichan)

{
  SoundRenderer *pSVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  sfxinfo_t *psVar5;
  bool bVar6;
  uint len;
  uint pos;
  bool evicted;
  FSoundChan *schan;
  FISoundChannel *ichan_local;
  
  if (ichan != (FISoundChannel *)0x0) {
    if (((uint)ichan[1].DistanceScale & 4) == 0) {
      if (((uint)ichan[1].DistanceScale & 0x102) == 0) {
        uVar2 = (*GSnd->_vptr_SoundRenderer[0x13])(GSnd,ichan);
        pSVar1 = GSnd;
        iVar3 = FSoundID::operator_cast_to_int((FSoundID *)&ichan[1].Rolloff);
        psVar5 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(long)iVar3);
        uVar4 = (*pSVar1->_vptr_SoundRenderer[9])(pSVar1,(psVar5->data).data);
        if (uVar2 == 0) {
          bVar6 = ((uint)ichan[1].DistanceScale & 0x200) != 0;
        }
        else {
          bVar6 = uVar2 < uVar4;
        }
      }
      else {
        bVar6 = true;
      }
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      ichan[1].DistanceScale = (float)((uint)ichan[1].DistanceScale | 2);
      ichan->SysChannel = (void *)0x0;
    }
    else {
      S_ReturnChannel((FSoundChan *)ichan);
    }
  }
  return;
}

Assistant:

void S_ChannelEnded(FISoundChannel *ichan)
{
	FSoundChan *schan = static_cast<FSoundChan*>(ichan);
	bool evicted;

	if (schan != NULL)
	{
		// If the sound was stopped with GSnd->StopSound(), then we know
		// it wasn't evicted. Otherwise, if it's looping, it must have
		// been evicted. If it's not looping, then it was evicted if it
		// didn't reach the end of its playback.
		if (schan->ChanFlags & CHAN_FORGETTABLE)
		{
			evicted = false;
		}
		else if (schan->ChanFlags & (CHAN_LOOP | CHAN_EVICTED))
		{
			evicted = true;
		}
		else
		{ 
			unsigned int pos = GSnd->GetPosition(schan);
			unsigned int len = GSnd->GetSampleLength(S_sfx[schan->SoundID].data);
			if (pos == 0)
			{
				evicted = !!(schan->ChanFlags & CHAN_JUSTSTARTED);
			}
			else
			{
				evicted = (pos < len);
			}
		}
		if (!evicted)
		{
			S_ReturnChannel(schan);
		}
		else
		{
			schan->ChanFlags |= CHAN_EVICTED;
			schan->SysChannel = NULL;
		}
	}
}